

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O0

yajl_gen_status yajl_gen_null(yajl_gen g)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  uint *in_RDI;
  uint _i;
  uint local_14;
  yajl_gen_status local_4;
  
  if (in_RDI[(ulong)in_RDI[1] + 4] == 7) {
    local_4 = yajl_gen_in_error_state;
  }
  else if (in_RDI[(ulong)in_RDI[1] + 4] == 6) {
    local_4 = yajl_gen_generation_complete;
  }
  else if ((in_RDI[(ulong)in_RDI[1] + 4] == 2) || (in_RDI[(ulong)in_RDI[1] + 4] == 1)) {
    local_4 = yajl_gen_keys_must_be_strings;
  }
  else {
    if ((in_RDI[(ulong)in_RDI[1] + 4] == 2) || (in_RDI[(ulong)in_RDI[1] + 4] == 5)) {
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),",",1);
      if ((*in_RDI & 1) != 0) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
      }
    }
    else if ((in_RDI[(ulong)in_RDI[1] + 4] == 3) &&
            ((**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),":",1), (*in_RDI & 1) != 0)
            ) {
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86)," ",1);
    }
    if (((*in_RDI & 1) != 0) && (in_RDI[(ulong)in_RDI[1] + 4] != 3)) {
      for (local_14 = 0; local_14 < in_RDI[1]; local_14 = local_14 + 1) {
        pcVar1 = *(code **)(in_RDI + 0x84);
        uVar2 = *(undefined8 *)(in_RDI + 0x86);
        uVar3 = *(undefined8 *)(in_RDI + 2);
        sVar4 = strlen(*(char **)(in_RDI + 2));
        (*pcVar1)(uVar2,uVar3,sVar4 & 0xffffffff);
      }
    }
    (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"null",4);
    switch(in_RDI[(ulong)in_RDI[1] + 4]) {
    case 0:
      in_RDI[(ulong)in_RDI[1] + 4] = 6;
      break;
    case 1:
    case 2:
      in_RDI[(ulong)in_RDI[1] + 4] = 3;
      break;
    case 3:
      in_RDI[(ulong)in_RDI[1] + 4] = 2;
      break;
    case 4:
      in_RDI[(ulong)in_RDI[1] + 4] = 5;
    }
    if (((*in_RDI & 1) != 0) && (in_RDI[(ulong)in_RDI[1] + 4] == 6)) {
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
    }
    local_4 = yajl_gen_status_ok;
  }
  return local_4;
}

Assistant:

yajl_gen_status
yajl_gen_null(yajl_gen g)
{
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, "null", strlen("null"));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}